

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Type> * __thiscall
wasm::IRBuilder::getLabelType
          (Result<wasm::Type> *__return_storage_ptr__,IRBuilder *this,Index label)

{
  __index_type *__return_storage_ptr___00;
  ScopeCtx **ppSVar1;
  bool bVar2;
  Type local_b8;
  uint local_ac;
  Err local_a8;
  Err *local_88;
  Err *err;
  undefined1 local_70 [8];
  Result<wasm::IRBuilder::ScopeCtx_*> _val;
  Result<wasm::IRBuilder::ScopeCtx_*> scope;
  Index label_local;
  IRBuilder *this_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
               super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20);
  getScope((Result<wasm::IRBuilder::ScopeCtx_*> *)__return_storage_ptr___00,this,label);
  Result<wasm::IRBuilder::ScopeCtx_*>::Result
            ((Result<wasm::IRBuilder::ScopeCtx_*> *)local_70,
             (Result<wasm::IRBuilder::ScopeCtx_*> *)__return_storage_ptr___00);
  local_88 = Result<wasm::IRBuilder::ScopeCtx_*>::getErr
                       ((Result<wasm::IRBuilder::ScopeCtx_*> *)local_70);
  bVar2 = local_88 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_a8,local_88);
    Result<wasm::Type>::Result(__return_storage_ptr__,&local_a8);
    wasm::Err::~Err(&local_a8);
  }
  local_ac = (uint)bVar2;
  Result<wasm::IRBuilder::ScopeCtx_*>::~Result((Result<wasm::IRBuilder::ScopeCtx_*> *)local_70);
  if (local_ac == 0) {
    ppSVar1 = Result<wasm::IRBuilder::ScopeCtx_*>::operator*
                        ((Result<wasm::IRBuilder::ScopeCtx_*> *)
                         ((long)&_val.val.
                                 super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                                 super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> +
                         0x20));
    local_b8 = ScopeCtx::getLabelType(*ppSVar1);
    Result<wasm::Type>::Result<wasm::Type>(__return_storage_ptr__,&local_b8);
    local_ac = 1;
  }
  Result<wasm::IRBuilder::ScopeCtx_*>::~Result
            ((Result<wasm::IRBuilder::ScopeCtx_*> *)
             ((long)&_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<Type> IRBuilder::getLabelType(Index label) {
  auto scope = getScope(label);
  CHECK_ERR(scope);
  return (*scope)->getLabelType();
}